

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

void __thiscall tl::StrT<char>::StrT(StrT<char> *this,u32 size,char c)

{
  u32 i;
  ulong uVar1;
  
  this->_str = &s_emptyStr<char>;
  this->_size = 0;
  resizeNoCopy(this,size);
  for (uVar1 = 0; uVar1 < this->_size; uVar1 = uVar1 + 1) {
    this->_str[uVar1] = c;
  }
  return;
}

Assistant:

StrT<CharT>::StrT(u32 size, CharT c)
    : StrT()
{
    resizeNoCopy(size);
    for(u32 i=0; i<_size; i++) {
        _str[i] = c;
    }
}